

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  bool bVar1;
  WorkingMode WVar2;
  string *psVar3;
  pointer this_00;
  reference this_01;
  reference gti;
  pointer mf_00;
  cmake *pcVar4;
  size_type __val;
  ostream *poVar5;
  rep_conflict rVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  string local_388;
  int local_364;
  duration<long,_std::ratio<1L,_1000000000L>_> local_360;
  duration<long,_std::ratio<1L,_1000L>_> local_358;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> ms;
  ostringstream msg;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1d8;
  time_point endTime;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  reference local_160;
  GlobalTargetInfo *globalTarget;
  iterator __end2;
  iterator __begin2;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *__range2;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *__range1;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  string local_f8;
  string local_d8;
  _Base_ptr local_b8;
  undefined1 local_b0;
  cmMakefile *local_98;
  cmMakefile *dirMf;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_88;
  __single_object dirMfu;
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  cmStateSnapshot snapshot;
  time_point startTime;
  cmGlobalGenerator *this_local;
  
  snapshot.Position.Position = std::chrono::_V2::steady_clock::now();
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  this->NextDeferId = 0;
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_30,this->CMakeInstance);
  cmStateSnapshot::GetDirectory(&local_58,(cmStateSnapshot *)local_30);
  psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource(&local_58,psVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&dirMfu,(cmStateSnapshot *)local_30);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&dirMfu,psVar3);
  dirMf = (cmMakefile *)this;
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&local_88,(cmStateSnapshot *)&dirMf);
  local_98 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(&local_88);
  std::
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ::push_back(&this->Makefiles,&local_88);
  cmMakefile::SetRecursionDepth(local_98,this->RecursionDepth);
  IndexMakefile(this,local_98);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  pVar7 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->BinaryDirectories,psVar3);
  local_b8 = (_Base_ptr)pVar7.first._M_node;
  local_b0 = pVar7.second;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->ExtraGenerator);
  if ((bVar1) && (bVar1 = cmake::GetIsInTryCompile(this->CMakeInstance), !bVar1)) {
    pcVar4 = this->CMakeInstance;
    this_00 = std::
              unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
              ::operator->(&this->ExtraGenerator);
    cmExternalMakefileProjectGenerator::GetName_abi_cxx11_(&local_f8,this_00);
    cmStrCat<char_const(&)[39],std::__cxx11::string,char_const(&)[148]>
              (&local_d8,(char (*) [39])"Support for \"Extra Generators\" like\n  ",&local_f8,
               (char (*) [148])
               "\nis deprecated and will be removed from a future version of CMake.  IDEs may use the cmake-file-api(7) to view CMake-generated project build trees."
              );
    globalTargets.
    super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)
               &globalTargets.
                super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmake::IssueMessage(pcVar4,DEPRECATION_WARNING,&local_d8,
                        (cmListFileBacktrace *)
                        &globalTargets.
                         super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &globalTargets.
                super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_98);
  cmMakefile::EnforceDirectoryLevelRules(local_98);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
            *)&__range1);
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ::begin(&this->Makefiles);
  mf = (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
       std::
       vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
       ::end(&this->Makefiles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
                                     *)&mf), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::
             vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             ::begin((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                      *)&__range1);
    globalTarget = (GlobalTargetInfo *)
                   std::
                   vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   ::end((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                          *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
                                       *)&globalTarget), bVar1) {
      gti = __gnu_cxx::
            __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
            ::operator*(&__end2);
      local_160 = gti;
      mf_00 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(this_01);
      CreateGlobalTarget(this,gti,mf_00);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)&__range1);
  pcVar4 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"CMAKE_NUMBER_OF_MAKEFILES",&local_181);
  __val = std::
          vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
          ::size(&this->Makefiles);
  std::__cxx11::to_string(&local_1a8,__val);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"number of local generators",
             (allocator<char> *)((long)&endTime.__d.__r + 7));
  cmake::AddCacheEntry(pcVar4,&local_180,&local_1a8,&local_1c8,4);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&endTime.__d.__r + 7));
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  local_1d8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  WVar2 = cmake::GetWorkingMode(this->CMakeInstance);
  if (WVar2 == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ms);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      std::operator<<((ostream *)&ms,"Configuring incomplete, errors occurred!");
    }
    else {
      local_360.__r =
           (rep_conflict)
           std::chrono::operator-
                     (&local_1d8,
                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&snapshot.Position.Position);
      local_358.__r =
           (rep_conflict)
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                     (&local_360);
      poVar5 = std::operator<<((ostream *)&ms,"Configuring done (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::fixed);
      local_364 = (int)std::setprecision(1);
      poVar5 = std::operator<<(poVar5,(_Setprecision)local_364);
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_358);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(longdouble)rVar6 / (longdouble)1000.0);
      std::operator<<(poVar5,"s)");
    }
    pcVar4 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmake::UpdateProgress(pcVar4,&local_388,-1.0);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ms);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_88);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  auto startTime = std::chrono::steady_clock::now();

  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();
  this->NextDeferId = 0;

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  auto dirMfu = cm::make_unique<cmMakefile>(this, snapshot);
  auto* dirMf = dirMfu.get();
  this->Makefiles.push_back(std::move(dirMfu));
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  if (this->ExtraGenerator && !this->CMakeInstance->GetIsInTryCompile()) {
    this->CMakeInstance->IssueMessage(
      MessageType::DEPRECATION_WARNING,
      cmStrCat("Support for \"Extra Generators\" like\n  ",
               this->ExtraGenerator->GetName(),
               "\nis deprecated and will be removed from a future version "
               "of CMake.  IDEs may use the cmake-file-api(7) to view "
               "CMake-generated project build trees."));
  }

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (const auto& mf : this->Makefiles) {
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        this->CreateGlobalTarget(globalTarget, mf.get());
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  this->GetCMakeInstance()->AddCacheEntry(
    "CMAKE_NUMBER_OF_MAKEFILES", std::to_string(this->Makefiles.size()),
    "number of local generators", cmStateEnums::INTERNAL);

  auto endTime = std::chrono::steady_clock::now();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccurredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
    } else {
      auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(
        endTime - startTime);
      msg << "Configuring done (" << std::fixed << std::setprecision(1)
          << ms.count() / 1000.0L << "s)";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}